

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O2

sysbvm_tuple_t sysbvm_float32_parseString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  sysbvm_context_t *cstring;
  sysbvm_tuple_t sVar1;
  sysbvm_context_t *context_00;
  
  cstring = (sysbvm_context_t *)malloc(stringSize + 1);
  context_00 = cstring;
  memcpy(cstring,string,stringSize);
  *(char *)((long)&(cstring->heap).firstMallocObject + stringSize) = '\0';
  sVar1 = sysbvm_float32_parseCString(context_00,(char *)cstring);
  free(cstring);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_float32_parseString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    char *buffer = (char*)malloc(stringSize + 1);
    memcpy(buffer, string, stringSize);
    buffer[stringSize] = 0;

    sysbvm_tuple_t result = sysbvm_float32_parseCString(context, buffer);
    free(buffer);
    return result;
}